

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O3

int IsNanOrInfDouble(double value)

{
  return (int)(((ulong)value & 0x8008000000000000) != 0x8000000000000 &&
              ((ulong)value & 0x7ff7ffffffffffff) == 0x7ff0000000000000);
}

Assistant:

int
IsNanOrInfDouble(double value)
{
  EpType        val;

  val.value = value;
  if (val.nan.exponent == EPD_EXP_INF &&
      val.nan.mantissa0 == 0 &&
      val.nan.mantissa1 == 0 &&
      (val.nan.sign == 1 || val.nan.quiet_bit == 0)) {
    return(1);
  }
  return(0);
}